

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrivateUtils.cpp
# Opt level: O0

Matrix3d * iDynTree::squareCrossProductMatrix(Vector3d *v)

{
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *this;
  CoeffReturnType s;
  Matrix3d *in_RDI;
  double vSqr [3];
  Matrix3d *ret;
  Index in_stack_fffffffffffffe58;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *in_stack_fffffffffffffe60;
  DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *in_stack_fffffffffffffe68;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *in_stack_fffffffffffffe70;
  
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)0x77418f);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator<<
            (in_stack_fffffffffffffe68,(Scalar *)in_stack_fffffffffffffe60);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
            (in_stack_fffffffffffffe70,(Scalar *)in_stack_fffffffffffffe68);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
            (in_stack_fffffffffffffe70,(Scalar *)in_stack_fffffffffffffe68);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
            (in_stack_fffffffffffffe70,(Scalar *)in_stack_fffffffffffffe68);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
            (in_stack_fffffffffffffe70,(Scalar *)in_stack_fffffffffffffe68);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
            (in_stack_fffffffffffffe70,(Scalar *)in_stack_fffffffffffffe68);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
            (in_stack_fffffffffffffe70,(Scalar *)in_stack_fffffffffffffe68);
  this = (CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
         Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                   (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  s = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)this->m_xpr,
                 in_stack_fffffffffffffe58);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_(this,s);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_(this,s);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::~CommaInitializer
            ((CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)0x774660);
  return in_RDI;
}

Assistant:

Eigen::Matrix3d squareCrossProductMatrix(const Eigen::Vector3d & v)
{
    Eigen::Matrix3d ret;

    double vSqr[3];
    vSqr[0] = v[0]*v[0];
    vSqr[1] = v[1]*v[1];
    vSqr[2] = v[2]*v[2];

    ret <<  -(vSqr[1]+vSqr[2]),         v[0]*v[1],          v[0]*v[2],
                    v[0]*v[1], -(vSqr[0]+vSqr[2]),          v[1]*v[2],
                    v[0]*v[2],          v[1]*v[2], -(vSqr[0]+vSqr[1]);

    return ret;
}